

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O0

void pipeline_2P_SP(size_t L,uint w)

{
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
  *object;
  Task *rhs;
  uint in_ESI;
  Executor *in_RDI;
  Task test;
  Task pipeline;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
  pl;
  size_t cnt;
  vector<int,_std::allocator<int>_> collection;
  mutex mutex;
  atomic<unsigned_long> j2;
  size_t j1;
  Taskflow taskflow;
  size_t N;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> mybuffer;
  vector<int,_std::allocator<int>_> source;
  size_t maxN;
  Executor executor;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff978;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff980;
  Taskflow *in_stack_fffffffffffff990;
  size_type in_stack_fffffffffffff998;
  Executor *this;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9a0;
  Executor *this_00;
  Executor *this_01;
  char *__s;
  FlowBuilder *this_02;
  allocator<char> local_5e1;
  string local_5e0 [8];
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>
  *in_stack_fffffffffffffa28;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>
  *in_stack_fffffffffffffa30;
  size_t in_stack_fffffffffffffa38;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
  *in_stack_fffffffffffffa40;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffa68;
  size_t in_stack_fffffffffffffa70;
  Task in_stack_fffffffffffffa78;
  undefined1 local_579 [41];
  Task local_550;
  pointer local_548;
  undefined1 *local_540;
  undefined8 local_538;
  undefined8 *local_530;
  undefined1 *local_528;
  Executor *local_520;
  pointer local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  Executor *local_4c0;
  undefined8 local_2e8;
  undefined1 local_2e0 [24];
  undefined1 local_2c8 [40];
  undefined8 local_2a0;
  undefined1 local_298 [296];
  __buckets_ptr local_170;
  FlowBuilder local_158 [42];
  Executor *local_8;
  
  object = (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
            *)(ulong)in_ESI;
  this_02 = local_158;
  local_8 = in_RDI;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffff980._M_current,
             in_stack_fffffffffffff978._M_current);
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffa78._node,in_stack_fffffffffffffa70,
             in_stack_fffffffffffffa68);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x127d2e);
  local_170 = (__buckets_ptr)0x64;
  __s = local_298 + 0x10f;
  std::allocator<int>::allocator((allocator<int> *)0x127d4c);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
             (allocator_type *)in_stack_fffffffffffff990);
  std::allocator<int>::~allocator((allocator<int> *)0x127d72);
  this_01 = (Executor *)(local_298 + 0x110);
  local_298._256_8_ =
       std::vector<int,_std::allocator<int>_>::begin
                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff978._M_current);
  local_298._248_8_ =
       std::vector<int,_std::allocator<int>_>::end
                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff978._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffff980,in_stack_fffffffffffff978,0);
  this_00 = local_8;
  std::allocator<std::array<int,_2UL>_>::allocator((allocator<std::array<int,_2UL>_> *)0x127dd6);
  std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
            ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)this_00,
             in_stack_fffffffffffff998,(allocator_type *)in_stack_fffffffffffff990);
  std::allocator<std::array<int,_2UL>_>::~allocator((allocator<std::array<int,_2UL>_> *)0x127dfc);
  for (local_298._208_8_ = (pointer)0x0; (ulong)local_298._208_8_ < (pointer)0x65;
      local_298._208_8_ = (long)(size_t *)local_298._208_8_ + 1) {
    tf::Taskflow::Taskflow((Taskflow *)this_00);
    local_298._0_8_ = (pointer)0x0;
    local_2a0 = 0;
    std::mutex::mutex((mutex *)0x127e4b);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x127e58);
    local_2e8 = 1;
    local_4e0 = (pointer)local_298._208_8_;
    local_4d8 = local_298 + 0x110;
    local_4d0 = local_298;
    local_4c8 = local_298 + 0xe0;
    local_4c0 = local_8;
    this = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:320:38)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>
            *)in_stack_fffffffffffff980._M_current,
           (PipeType)((ulong)in_stack_fffffffffffff978._M_current >> 0x20),
           (anon_class_40_5_1f4a69ea_for__callable *)0x127edb);
    local_548 = (pointer)local_298._208_8_;
    local_540 = local_2e0;
    local_538 = local_2c8;
    local_530 = &local_2a0;
    local_528 = local_298 + 0xe0;
    local_520 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:333:7)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>
            *)in_stack_fffffffffffff980._M_current,
           (PipeType)((ulong)in_stack_fffffffffffff978._M_current >> 0x20),
           (anon_class_48_6_e785244e_for__callable *)0x127f57);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:320:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:333:7)>_>
    ::Pipeline(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa28);
    tf::FlowBuilder::
    composed_of<tf::Pipeline<tf::Pipe<pipeline_2P_SP(unsigned_long,unsigned_int)::__0>,tf::Pipe<pipeline_2P_SP(unsigned_long,unsigned_int)::__1>>>
              (this_02,object);
    in_stack_fffffffffffff990 = (Taskflow *)local_579;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
               (allocator<char> *)this_01);
    rhs = tf::Task::name((Task *)in_stack_fffffffffffff980._M_current,
                         (string *)in_stack_fffffffffffff978._M_current);
    tf::Task::Task(&local_550,rhs);
    std::__cxx11::string::~string((string *)(local_579 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_579);
    in_stack_fffffffffffffa40 =
         (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
          *)local_298;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:344:34),_nullptr>
              (this_02,(anon_class_48_6_b70a4db3 *)object);
    in_stack_fffffffffffff980._M_current = (int *)&local_5e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
               (allocator<char> *)this_01);
    in_stack_fffffffffffff978._M_current =
         (int *)tf::Task::name(in_stack_fffffffffffff980._M_current,
                               in_stack_fffffffffffff978._M_current);
    tf::Task::Task((Task *)&stack0xfffffffffffffa78,(Task *)in_stack_fffffffffffff978._M_current);
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator(&local_5e1);
    tf::Task::precede<tf::Task&>
              ((Task *)in_stack_fffffffffffff980._M_current,
               (Task *)in_stack_fffffffffffff978._M_current);
    tf::Executor::run_n<pipeline_2P_SP(unsigned_long,unsigned_int)::__3>
              (this,in_stack_fffffffffffff990,(size_t)rhs,
               (anon_class_40_5_4fb09de8 *)in_stack_fffffffffffff980._M_current);
    std::future<void>::get((future<void> *)in_stack_fffffffffffff990);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff980._M_current);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:320:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:333:7)>_>
    ::~Pipeline((Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
                 *)in_stack_fffffffffffff980._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990);
    tf::Taskflow::~Taskflow((Taskflow *)in_stack_fffffffffffff980._M_current);
  }
  std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~vector
            ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
             in_stack_fffffffffffff990);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990);
  tf::Executor::~Executor(this_01);
  return;
}

Assistant:

void pipeline_2P_SP(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  std::vector<std::array<int, 2>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0;
    std::atomic<size_t> j2 = 0;
    std::mutex mutex;
    std::vector<int> collection;
    size_t cnt = 1;

    tf::Pipeline pl(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1, &mybuffer, L](auto& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        //*(pf.output()) = source[j1] + 1;
        mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        j1++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL,
      [N, &collection, &mutex, &j2, &mybuffer, L](auto& pf) mutable {
        REQUIRE(j2++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex);
          REQUIRE(pf.token() % L == pf.line());
          collection.push_back(mybuffer[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline = taskflow.composed_of(pl).name("module_of_pipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);

      std::sort(collection.begin(), collection.end());
      for(size_t i = 0; i < N; i++) {
        REQUIRE(collection[i] == i + 1);
      }
      REQUIRE(pl.num_tokens() == cnt * N);
    }).name("test");

    pipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = 0;
      collection.clear();
      for(size_t i = 0; i < mybuffer.size(); ++i){
        for(size_t j = 0; j < mybuffer[0].size(); ++j){
          mybuffer[i][j] = 0;
        }
      }
      cnt++;
    }).get();
  }
}